

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DPIExportSyntax *pDVar1;
  BumpAllocator *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  Token *in_stack_00000020;
  Token *in_stack_00000028;
  Token *in_stack_00000030;
  Token *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_00000048;
  Token *in_stack_00000070;
  Token *in_stack_00000078;
  Token *in_stack_00000080;
  BumpAllocator *in_stack_000000a8;
  Token *in_stack_000000b0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000010,in_stack_00000008);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DPIExportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,in_stack_00000020,in_stack_00000070,in_stack_00000078,
                      in_stack_00000080);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DPIExportSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DPIExportSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.specString.deepClone(alloc),
        node.c_identifier.deepClone(alloc),
        node.equals.deepClone(alloc),
        node.functionOrTask.deepClone(alloc),
        node.name.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}